

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

string * __thiscall FastPForLib::Simple16<true>::name_abi_cxx11_(Simple16<true> *this)

{
  string *in_RDI;
  allocator local_11 [17];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"Simple16",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::string name() const { return "Simple16"; }